

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch.cc
# Opt level: O0

void __thiscall leveldb::WriteBatch::WriteBatch(WriteBatch *this)

{
  WriteBatch *this_local;
  
  std::__cxx11::string::string((string *)this);
  Clear(this);
  return;
}

Assistant:

WriteBatch::WriteBatch() { Clear(); }